

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

float common_embd_similarity_cos(float *embd1,float *embd2,int n)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  dVar5 = 0.0;
  dVar6 = 0.0;
  dVar7 = 0.0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    fVar4 = embd1[uVar2];
    fVar1 = embd2[uVar2];
    dVar7 = dVar7 + (double)(fVar4 * fVar1);
    dVar5 = dVar5 + (double)(fVar4 * fVar4);
    dVar6 = dVar6 + (double)(fVar1 * fVar1);
  }
  if (((dVar5 == 0.0) && (!NAN(dVar5))) || ((dVar6 == 0.0 && (!NAN(dVar6))))) {
    if (dVar5 == 0.0 && dVar6 == 0.0) {
      fVar4 = 1.0;
    }
    else {
      fVar4 = 0.0;
    }
  }
  else {
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    fVar4 = (float)(dVar7 / (dVar5 * dVar6));
  }
  return fVar4;
}

Assistant:

float common_embd_similarity_cos(const float * embd1, const float * embd2, int n){
    double sum  = 0.0;
    double sum1 = 0.0;
    double sum2 = 0.0;

    for (int i = 0; i < n; i++) {
        sum  += embd1[i] * embd2[i];
        sum1 += embd1[i] * embd1[i];
        sum2 += embd2[i] * embd2[i];
    }

    // Handle the case where one or both vectors are zero vectors
    if (sum1 == 0.0 || sum2 == 0.0) {
        if (sum1 == 0.0 && sum2 == 0.0) {
            return 1.0f; // two zero vectors are similar
        }
        return 0.0f;
    }

    return sum / (sqrt(sum1) * sqrt(sum2));
}